

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void __thiscall
duckdb::BitpackingScanState<int,_int>::Skip
          (BitpackingScanState<int,_int> *this,ColumnSegment *segment,idx_t skip_count)

{
  int *dst;
  byte width;
  idx_t iVar1;
  ulong uVar2;
  ulong size;
  uint uVar3;
  ulong uVar4;
  
  iVar1 = this->current_group_offset;
  uVar2 = iVar1 + skip_count;
  if (uVar2 < 0x800) {
    uVar2 = 0;
  }
  else {
    uVar2 = uVar2 >> 0xb;
    this->bitpacking_metadata_ptr = this->bitpacking_metadata_ptr + -(uVar2 * 4 + -4);
    LoadNextGroup(this);
    uVar2 = ((uVar2 - 1) * 0x800 - iVar1) + 0x800;
  }
  uVar4 = skip_count - uVar2;
  uVar3 = (uint)(this->current_group).mode;
  if ((uVar3 < 6) && ((0x2cU >> (uVar3 & 0x1f) & 1) != 0)) {
    this->current_group_offset = this->current_group_offset + uVar4;
  }
  else {
    for (; uVar2 < skip_count; uVar2 = uVar2 + size) {
      width = this->current_width;
      uVar3 = (uint)this->current_group_offset & 0x1f;
      size = 0x20 - (ulong)uVar3;
      if (uVar4 < 0x20 - (ulong)uVar3) {
        size = uVar4;
      }
      BitpackingPrimitives::UnPackGroup<int>
                ((data_ptr_t)this->decompression_buffer,
                 this->current_group_ptr +
                 (((ulong)width * this->current_group_offset >> 3) - (ulong)(uVar3 * width >> 3)),
                 width,true);
      dst = this->decompression_buffer + uVar3;
      ApplyFrameOfReference<int>(dst,this->current_frame_of_reference,size);
      DeltaDecode<int>(dst,this->current_delta_offset,size);
      this->current_delta_offset = dst[(size & 0xffffffff) - 1];
      this->current_group_offset = this->current_group_offset + size;
      uVar4 = uVar4 - size;
    }
  }
  return;
}

Assistant:

void Skip(ColumnSegment &segment, idx_t skip_count) {
		bool skip_sign_extend = true;

		idx_t skipped = 0;
		idx_t initial_group_offset = current_group_offset;

		// This skips straight to the correct metadata group
		idx_t meta_groups_to_skip = (skip_count + current_group_offset) / BITPACKING_METADATA_GROUP_SIZE;
		if (meta_groups_to_skip) {

			// bitpacking_metadata_ptr points to the next metadata: this means we need to advance the pointer by n-1
			bitpacking_metadata_ptr -= (meta_groups_to_skip - 1) * sizeof(bitpacking_metadata_encoded_t);
			LoadNextGroup();
			// The first (partial) group we skipped
			skipped += BITPACKING_METADATA_GROUP_SIZE - initial_group_offset;
			// The remaining groups that were skipped
			skipped += (meta_groups_to_skip - 1) * BITPACKING_METADATA_GROUP_SIZE;
		}

		// Assert we can are in the correct metadata group
		idx_t remaining_to_skip = skip_count - skipped;
		D_ASSERT(current_group_offset + remaining_to_skip < BITPACKING_METADATA_GROUP_SIZE);

		if (current_group.mode == BitpackingMode::CONSTANT || current_group.mode == BitpackingMode::CONSTANT_DELTA ||
		    current_group.mode == BitpackingMode::FOR) {
			// Skipping within a constant or constant delta is done by increasing the current_group_offset
			skipped += remaining_to_skip;
			current_group_offset += remaining_to_skip;
		} else {
			// For DELTA we actually need to decompress from the current_group_offset up until the row we want to skip
			// to this is because we need that delta to be able to continue scanning from here
			D_ASSERT(current_group.mode == BitpackingMode::DELTA_FOR);

			while (skipped < skip_count) {
				// Calculate compression group offset and pointer
				idx_t offset_in_compression_group =
				    current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;
				data_ptr_t current_position_ptr = current_group_ptr + current_group_offset * current_width / 8;
				data_ptr_t decompression_group_start_pointer =
				    current_position_ptr - offset_in_compression_group * current_width / 8;

				idx_t skipping_this_algorithm_group =
				    MinValue(remaining_to_skip,
				             BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE - offset_in_compression_group);

				BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(decompression_buffer),
				                                     decompression_group_start_pointer, current_width,
				                                     skip_sign_extend);

				T *decompression_ptr = decompression_buffer + offset_in_compression_group;
				ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(decompression_ptr),
				                           static_cast<T_S>(current_frame_of_reference), skipping_this_algorithm_group);
				DeltaDecode<T_S>(reinterpret_cast<T_S *>(decompression_ptr), static_cast<T_S>(current_delta_offset),
				                 skipping_this_algorithm_group);
				current_delta_offset = decompression_ptr[skipping_this_algorithm_group - 1];

				skipped += skipping_this_algorithm_group;
				current_group_offset += skipping_this_algorithm_group;
				remaining_to_skip -= skipping_this_algorithm_group;
			}
		}

		D_ASSERT(skipped == skip_count);
	}